

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O3

void ImageFormat(Image *image,int newFormat)

{
  ushort uVar1;
  char cVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  undefined6 uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  int iVar11;
  float *__ptr;
  void *pvVar12;
  float *pfVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  long lVar17;
  size_t __size;
  char cVar18;
  char cVar19;
  float fVar20;
  float fStack_54;
  
  pvVar12 = image->data;
  if ((((pvVar12 != (void *)0x0) && (image->width != 0)) && (newFormat != 0 && image->height != 0))
     && (iVar11 = image->format, iVar11 != newFormat)) {
    if (10 < newFormat || 10 < iVar11) {
      TraceLog(4,"IMAGE: Data format is compressed, can not be converted");
      return;
    }
    uVar15 = image->height * image->width;
    __ptr = (float *)malloc((long)(int)uVar15 << 4);
    if (0 < (int)uVar15) {
      pfVar13 = __ptr + 3;
      uVar14 = 0;
      iVar16 = 0;
      do {
        switch(iVar11) {
        case 1:
          fVar20 = (float)*(byte *)((long)pvVar12 + uVar14) / 255.0;
          pfVar13[-3] = fVar20;
          pfVar13[-2] = fVar20;
          pfVar13[-1] = fVar20;
          goto LAB_0013ba0c;
        case 2:
          fVar20 = (float)*(byte *)((long)pvVar12 + (long)iVar16) / 255.0;
          pfVar13[-3] = fVar20;
          pfVar13[-2] = fVar20;
          pfVar13[-1] = fVar20;
          *pfVar13 = (float)*(byte *)((long)pvVar12 + (long)iVar16 + 1) / 255.0;
          iVar16 = iVar16 + 2;
          break;
        case 3:
          uVar1 = *(ushort *)((long)pvVar12 + uVar14 * 2);
          pfVar13[-3] = (float)(uVar1 >> 0xb) * 0.032258064;
          pfVar13[-2] = (float)(uVar1 >> 5 & 0x3f) * 0.015873017;
          pfVar13[-1] = (float)(uVar1 & 0x1f) * 0.032258064;
          goto LAB_0013ba0c;
        case 4:
          lVar17 = (long)iVar16;
          pfVar13[-3] = (float)*(byte *)((long)pvVar12 + lVar17) / 255.0;
          pfVar13[-2] = (float)*(byte *)((long)pvVar12 + lVar17 + 1) / 255.0;
          fVar20 = (float)*(byte *)((long)pvVar12 + lVar17 + 2) / 255.0;
          goto LAB_0013bb49;
        case 5:
          uVar1 = *(ushort *)((long)pvVar12 + uVar14 * 2);
          pfVar13[-3] = (float)(uVar1 >> 0xb) * 0.032258064;
          pfVar13[-2] = (float)(uVar1 >> 6 & 0x1f) * 0.032258064;
          pfVar13[-1] = (float)(uVar1 >> 1 & 0x1f) * 0.032258064;
          fVar20 = 0.0;
          if ((uVar1 & 1) != 0) {
            fVar20 = 1.0;
          }
          *pfVar13 = fVar20;
          break;
        case 6:
          uVar1 = *(ushort *)((long)pvVar12 + uVar14 * 2);
          pfVar13[-3] = (float)(uVar1 >> 0xc) * 0.06666667;
          pfVar13[-2] = (float)(uVar1 >> 8 & 0xf) * 0.06666667;
          pfVar13[-1] = (float)(uVar1 >> 4 & 0xf) * 0.06666667;
          *pfVar13 = (float)(uVar1 & 0xf) * 0.06666667;
          break;
        case 7:
          lVar17 = (long)iVar16;
          pfVar13[-3] = (float)*(byte *)((long)pvVar12 + lVar17) / 255.0;
          pfVar13[-2] = (float)*(byte *)((long)pvVar12 + lVar17 + 1) / 255.0;
          pfVar13[-1] = (float)*(byte *)((long)pvVar12 + lVar17 + 2) / 255.0;
          fVar20 = (float)*(byte *)((long)pvVar12 + lVar17 + 3) / 255.0;
          goto LAB_0013bb1f;
        case 8:
          pfVar13[-3] = *(float *)((long)pvVar12 + (long)iVar16 * 4);
          pfVar13[-2] = 0.0;
          pfVar13[-1] = 0.0;
LAB_0013ba0c:
          *pfVar13 = 1.0;
          break;
        case 9:
          lVar17 = (long)iVar16;
          pfVar13[-3] = *(float *)((long)pvVar12 + lVar17 * 4);
          pfVar13[-2] = *(float *)((long)pvVar12 + lVar17 * 4 + 4);
          fVar20 = *(float *)((long)pvVar12 + lVar17 * 4 + 8);
LAB_0013bb49:
          pfVar13[-1] = fVar20;
          *pfVar13 = 1.0;
          iVar16 = iVar16 + 3;
          break;
        case 10:
          lVar17 = (long)iVar16;
          pfVar13[-3] = *(float *)((long)pvVar12 + lVar17 * 4);
          pfVar13[-2] = *(float *)((long)pvVar12 + lVar17 * 4 + 4);
          pfVar13[-1] = *(float *)((long)pvVar12 + lVar17 * 4 + 8);
          fVar20 = *(float *)((long)pvVar12 + lVar17 * 4 + 0xc);
LAB_0013bb1f:
          *pfVar13 = fVar20;
          iVar16 = iVar16 + 4;
        }
        uVar14 = uVar14 + 1;
        pfVar13 = pfVar13 + 4;
      } while (uVar15 != uVar14);
    }
    free(pvVar12);
    image->data = (void *)0x0;
    image->format = newFormat;
    switch(newFormat) {
    case 1:
      __size = (long)image->height * (long)image->width;
      pvVar12 = malloc(__size);
      image->data = pvVar12;
      if (0 < (int)__size) {
        pfVar13 = __ptr + 2;
        lVar17 = 0;
        do {
          *(char *)((long)image->data + lVar17) =
               (char)(int)((*pfVar13 * 0.114 + pfVar13[-2] * 0.299 + pfVar13[-1] * 0.587) * 255.0);
          lVar17 = lVar17 + 1;
          pfVar13 = pfVar13 + 4;
        } while (lVar17 < (long)image->height * (long)image->width);
      }
      break;
    case 2:
      iVar11 = image->width * image->height * 2;
      pvVar12 = malloc((long)iVar11);
      image->data = pvVar12;
      if (0 < iVar11) {
        lVar17 = 0;
        do {
          *(char *)((long)image->data + lVar17) =
               (char)(int)((__ptr[lVar17 * 2 + 2] * 0.114 +
                           __ptr[lVar17 * 2] * 0.299 + __ptr[lVar17 * 2 + 1] * 0.587) * 255.0);
          *(char *)((long)image->data + lVar17 + 1) = (char)(int)(__ptr[lVar17 * 2 + 3] * 255.0);
          lVar17 = lVar17 + 2;
        } while (lVar17 < image->width * image->height * 2);
      }
      break;
    case 3:
      lVar17 = (long)image->height * (long)image->width;
      pvVar12 = malloc(lVar17 * 2);
      image->data = pvVar12;
      if (0 < (int)lVar17) {
        pfVar13 = __ptr + 2;
        lVar17 = 0;
        do {
          fVar20 = roundf(*pfVar13 * 31.0);
          fVar7 = (float)*(undefined8 *)(pfVar13 + -2) * 31.0;
          fVar9 = (float)((ulong)*(undefined8 *)(pfVar13 + -2) >> 0x20) * 63.0;
          fVar8 = roundf(fVar7);
          fStack_54 = (float)(CONCAT17((char)((uint)fVar9 >> 0x18),
                                       CONCAT16((char)((uint)fVar9 >> 0x10),
                                                CONCAT15((char)((uint)fVar9 >> 8),
                                                         CONCAT14(SUB41(fVar9,0),fVar7)))) >> 0x20);
          fVar7 = roundf(fStack_54);
          iVar11 = (int)fVar8;
          iVar16 = (int)fVar7;
          cVar19 = (char)((uint)iVar16 >> 0x10);
          uVar6 = CONCAT15((char)((uint)iVar16 >> 8),CONCAT14((char)iVar16,iVar11));
          sVar3 = (short)iVar11;
          sVar4 = (short)((uint6)uVar6 >> 0x20);
          sVar5 = (short)(CONCAT17((char)((uint)iVar16 >> 0x18),CONCAT16(cVar19,uVar6)) >> 0x30);
          *(ushort *)((long)image->data + lVar17 * 2) =
               (ushort)(int)fVar20 & 0xff |
               CONCAT11((0 < sVar5) * (sVar5 < 0x100) * cVar19 - (0xff < sVar5),
                        (0 < sVar4) * (sVar4 < 0x100) * (char)iVar16 - (0xff < sVar4)) * 0x20 |
               (ushort)(byte)((0 < sVar3) * (sVar3 < 0x100) * (char)iVar11 - (0xff < sVar3)) * 0x800
          ;
          lVar17 = lVar17 + 1;
          pfVar13 = pfVar13 + 4;
        } while (lVar17 < (long)image->height * (long)image->width);
      }
      break;
    case 4:
      iVar11 = image->width * image->height * 3;
      pvVar12 = malloc((long)iVar11);
      image->data = pvVar12;
      if (0 < iVar11) {
        pfVar13 = __ptr + 2;
        lVar17 = 0;
        do {
          *(char *)((long)image->data + lVar17) = (char)(int)(pfVar13[-2] * 255.0);
          *(char *)((long)image->data + lVar17 + 1) = (char)(int)(pfVar13[-1] * 255.0);
          *(char *)((long)image->data + lVar17 + 2) = (char)(int)(*pfVar13 * 255.0);
          lVar17 = lVar17 + 3;
          pfVar13 = pfVar13 + 4;
        } while (lVar17 < image->width * image->height * 3);
      }
      break;
    case 5:
      lVar17 = (long)image->height * (long)image->width;
      pvVar12 = malloc(lVar17 * 2);
      image->data = pvVar12;
      if (0 < (int)lVar17) {
        lVar17 = 0;
        pfVar13 = __ptr;
        do {
          fVar7 = roundf(*pfVar13 * 31.0);
          fVar20 = pfVar13[3];
          fVar8 = (float)*(undefined8 *)(pfVar13 + 1) * 31.0;
          fVar10 = (float)((ulong)*(undefined8 *)(pfVar13 + 1) >> 0x20) * 31.0;
          fVar9 = roundf(fVar8);
          fStack_54 = (float)(CONCAT17((char)((uint)fVar10 >> 0x18),
                                       CONCAT16((char)((uint)fVar10 >> 0x10),
                                                CONCAT15((char)((uint)fVar10 >> 8),
                                                         CONCAT14(SUB41(fVar10,0),fVar8)))) >> 0x20)
          ;
          fVar8 = roundf(fStack_54);
          iVar11 = (int)fVar9;
          iVar16 = (int)fVar8;
          cVar18 = (char)((uint)iVar16 >> 0x10);
          uVar6 = CONCAT15((char)((uint)iVar16 >> 8),CONCAT14((char)iVar16,iVar11));
          sVar3 = (short)iVar11;
          cVar19 = (0 < sVar3) * (sVar3 < 0x100) * (char)iVar11 - (0xff < sVar3);
          sVar3 = (short)((uint)iVar11 >> 0x10);
          sVar4 = (short)((uint6)uVar6 >> 0x20);
          cVar2 = (0 < sVar4) * (sVar4 < 0x100) * (char)iVar16 - (0xff < sVar4);
          sVar4 = (short)(CONCAT17((char)((uint)iVar16 >> 0x18),CONCAT16(cVar18,uVar6)) >> 0x30);
          sVar5 = CONCAT11((0 < sVar3) * (sVar3 < 0x100) * (char)((uint)iVar11 >> 0x10) -
                           (0xff < sVar3),cVar19);
          sVar3 = (short)(CONCAT13((0 < sVar4) * (sVar4 < 0x100) * cVar18 - (0xff < sVar4),
                                   CONCAT12(cVar2,sVar5)) >> 0x10);
          uVar1 = (ushort)(byte)((0 < sVar5) * (sVar5 < 0x100) * cVar19 - (0xff < sVar5)) * 0x40;
          sVar3 = (ushort)(byte)((0 < sVar3) * (sVar3 < 0x100) * cVar2 - (0xff < sVar3)) * 2;
          *(ushort *)((long)image->data + lVar17 * 2) =
               (ushort)(CONCAT13((char)((ushort)sVar3 >> 8),CONCAT12((char)sVar3,uVar1)) >> 0x10) |
               uVar1 | (ushort)(0.19607843 < fVar20) | (ushort)((int)fVar7 << 0xb);
          lVar17 = lVar17 + 1;
          pfVar13 = pfVar13 + 4;
        } while (lVar17 < (long)image->height * (long)image->width);
      }
      break;
    case 6:
      lVar17 = (long)image->height * (long)image->width;
      pvVar12 = malloc(lVar17 * 2);
      image->data = pvVar12;
      if (0 < (int)lVar17) {
        lVar17 = 0;
        pfVar13 = __ptr;
        do {
          fVar20 = roundf(*pfVar13 * 15.0);
          fVar7 = roundf(pfVar13[3] * 15.0);
          fVar8 = (float)*(undefined8 *)(pfVar13 + 1) * 15.0;
          fVar10 = (float)((ulong)*(undefined8 *)(pfVar13 + 1) >> 0x20) * 15.0;
          fVar9 = roundf(fVar8);
          fStack_54 = (float)(CONCAT17((char)((uint)fVar10 >> 0x18),
                                       CONCAT16((char)((uint)fVar10 >> 0x10),
                                                CONCAT15((char)((uint)fVar10 >> 8),
                                                         CONCAT14(SUB41(fVar10,0),fVar8)))) >> 0x20)
          ;
          fVar8 = roundf(fStack_54);
          iVar11 = (int)fVar9;
          iVar16 = (int)fVar8;
          cVar18 = (char)((uint)iVar16 >> 0x10);
          uVar6 = CONCAT15((char)((uint)iVar16 >> 8),CONCAT14((char)iVar16,iVar11));
          sVar3 = (short)iVar11;
          cVar19 = (0 < sVar3) * (sVar3 < 0x100) * (char)iVar11 - (0xff < sVar3);
          sVar3 = (short)((uint)iVar11 >> 0x10);
          sVar4 = (short)((uint6)uVar6 >> 0x20);
          cVar2 = (0 < sVar4) * (sVar4 < 0x100) * (char)iVar16 - (0xff < sVar4);
          sVar4 = (short)(CONCAT17((char)((uint)iVar16 >> 0x18),CONCAT16(cVar18,uVar6)) >> 0x30);
          sVar5 = CONCAT11((0 < sVar3) * (sVar3 < 0x100) * (char)((uint)iVar11 >> 0x10) -
                           (0xff < sVar3),cVar19);
          sVar3 = (short)(CONCAT13((0 < sVar4) * (sVar4 < 0x100) * cVar18 - (0xff < sVar4),
                                   CONCAT12(cVar2,sVar5)) >> 0x10);
          uVar1 = (ushort)(byte)((0 < sVar5) * (sVar5 < 0x100) * cVar19 - (0xff < sVar5)) * 0x100;
          sVar3 = (ushort)(byte)((0 < sVar3) * (sVar3 < 0x100) * cVar2 - (0xff < sVar3)) * 0x10;
          *(ushort *)((long)image->data + lVar17 * 2) =
               (ushort)(int)fVar7 & 0xff |
               (ushort)(CONCAT13((char)((ushort)sVar3 >> 8),CONCAT12((char)sVar3,uVar1)) >> 0x10) |
               uVar1 | (ushort)((int)fVar20 << 0xc);
          lVar17 = lVar17 + 1;
          pfVar13 = pfVar13 + 4;
        } while (lVar17 < (long)image->height * (long)image->width);
      }
      break;
    case 7:
      iVar11 = image->width * image->height * 4;
      pvVar12 = malloc((long)iVar11);
      image->data = pvVar12;
      if (0 < iVar11) {
        lVar17 = 0;
        do {
          *(char *)((long)image->data + lVar17) = (char)(int)(__ptr[lVar17] * 255.0);
          *(char *)((long)image->data + lVar17 + 1) = (char)(int)(__ptr[lVar17 + 1] * 255.0);
          *(char *)((long)image->data + lVar17 + 2) = (char)(int)(__ptr[lVar17 + 2] * 255.0);
          *(char *)((long)image->data + lVar17 + 3) = (char)(int)(__ptr[lVar17 + 3] * 255.0);
          lVar17 = lVar17 + 4;
        } while (lVar17 < image->width * image->height * 4);
      }
      break;
    case 8:
      lVar17 = (long)image->height * (long)image->width;
      pvVar12 = malloc(lVar17 * 4);
      image->data = pvVar12;
      if (0 < (int)lVar17) {
        pfVar13 = __ptr + 2;
        lVar17 = 0;
        do {
          *(float *)((long)image->data + lVar17 * 4) =
               *pfVar13 * 0.114 + pfVar13[-2] * 0.299 + pfVar13[-1] * 0.587;
          lVar17 = lVar17 + 1;
          pfVar13 = pfVar13 + 4;
        } while (lVar17 < (long)image->height * (long)image->width);
      }
      break;
    case 9:
      iVar11 = image->width * image->height * 3;
      pvVar12 = malloc((long)iVar11 * 4);
      image->data = pvVar12;
      if (0 < iVar11) {
        pfVar13 = __ptr + 2;
        lVar17 = 0;
        do {
          *(float *)((long)image->data + lVar17 * 4) = pfVar13[-2];
          *(float *)((long)image->data + lVar17 * 4 + 4) = pfVar13[-1];
          *(float *)((long)image->data + lVar17 * 4 + 8) = *pfVar13;
          lVar17 = lVar17 + 3;
          pfVar13 = pfVar13 + 4;
        } while (lVar17 < image->width * image->height * 3);
      }
      break;
    case 10:
      iVar11 = image->width * image->height * 4;
      pvVar12 = malloc((long)iVar11 * 4);
      image->data = pvVar12;
      if (0 < iVar11) {
        lVar17 = 0;
        do {
          *(float *)((long)image->data + lVar17 * 4) = __ptr[lVar17];
          *(float *)((long)image->data + lVar17 * 4 + 4) = __ptr[lVar17 + 1];
          *(float *)((long)image->data + lVar17 * 4 + 8) = __ptr[lVar17 + 2];
          *(float *)((long)image->data + lVar17 * 4 + 0xc) = __ptr[lVar17 + 3];
          lVar17 = lVar17 + 4;
        } while (lVar17 < image->width * image->height * 4);
      }
    }
    free(__ptr);
    if ((1 < image->mipmaps) && (image->mipmaps = 1, image->data != (void *)0x0)) {
      ImageMipmaps(image);
      return;
    }
  }
  return;
}

Assistant:

void ImageFormat(Image *image, int newFormat)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    if ((newFormat != 0) && (image->format != newFormat))
    {
        if ((image->format < PIXELFORMAT_COMPRESSED_DXT1_RGB) && (newFormat < PIXELFORMAT_COMPRESSED_DXT1_RGB))
        {
            Vector4 *pixels = LoadImageDataNormalized(*image);     // Supports 8 to 32 bit per channel

            RL_FREE(image->data);      // WARNING! We loose mipmaps data --> Regenerated at the end...
            image->data = NULL;
            image->format = newFormat;

            int k = 0;

            switch (image->format)
            {
                case PIXELFORMAT_UNCOMPRESSED_GRAYSCALE:
                {
                    image->data = (unsigned char *)RL_MALLOC(image->width*image->height*sizeof(unsigned char));

                    for (int i = 0; i < image->width*image->height; i++)
                    {
                        ((unsigned char *)image->data)[i] = (unsigned char)((pixels[i].x*0.299f + pixels[i].y*0.587f + pixels[i].z*0.114f)*255.0f);
                    }

                } break;
                case PIXELFORMAT_UNCOMPRESSED_GRAY_ALPHA:
                {
                    image->data = (unsigned char *)RL_MALLOC(image->width*image->height*2*sizeof(unsigned char));

                    for (int i = 0; i < image->width*image->height*2; i += 2, k++)
                    {
                        ((unsigned char *)image->data)[i] = (unsigned char)((pixels[k].x*0.299f + (float)pixels[k].y*0.587f + (float)pixels[k].z*0.114f)*255.0f);
                        ((unsigned char *)image->data)[i + 1] = (unsigned char)(pixels[k].w*255.0f);
                    }

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R5G6B5:
                {
                    image->data = (unsigned short *)RL_MALLOC(image->width*image->height*sizeof(unsigned short));

                    unsigned char r = 0;
                    unsigned char g = 0;
                    unsigned char b = 0;

                    for (int i = 0; i < image->width*image->height; i++)
                    {
                        r = (unsigned char)(round(pixels[i].x*31.0f));
                        g = (unsigned char)(round(pixels[i].y*63.0f));
                        b = (unsigned char)(round(pixels[i].z*31.0f));

                        ((unsigned short *)image->data)[i] = (unsigned short)r << 11 | (unsigned short)g << 5 | (unsigned short)b;
                    }

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R8G8B8:
                {
                    image->data = (unsigned char *)RL_MALLOC(image->width*image->height*3*sizeof(unsigned char));

                    for (int i = 0, k = 0; i < image->width*image->height*3; i += 3, k++)
                    {
                        ((unsigned char *)image->data)[i] = (unsigned char)(pixels[k].x*255.0f);
                        ((unsigned char *)image->data)[i + 1] = (unsigned char)(pixels[k].y*255.0f);
                        ((unsigned char *)image->data)[i + 2] = (unsigned char)(pixels[k].z*255.0f);
                    }
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R5G5B5A1:
                {
                    image->data = (unsigned short *)RL_MALLOC(image->width*image->height*sizeof(unsigned short));

                    unsigned char r = 0;
                    unsigned char g = 0;
                    unsigned char b = 0;
                    unsigned char a = 0;

                    for (int i = 0; i < image->width*image->height; i++)
                    {
                        r = (unsigned char)(round(pixels[i].x*31.0f));
                        g = (unsigned char)(round(pixels[i].y*31.0f));
                        b = (unsigned char)(round(pixels[i].z*31.0f));
                        a = (pixels[i].w > ((float)PIXELFORMAT_UNCOMPRESSED_R5G5B5A1_ALPHA_THRESHOLD/255.0f))? 1 : 0;

                        ((unsigned short *)image->data)[i] = (unsigned short)r << 11 | (unsigned short)g << 6 | (unsigned short)b << 1 | (unsigned short)a;
                    }

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R4G4B4A4:
                {
                    image->data = (unsigned short *)RL_MALLOC(image->width*image->height*sizeof(unsigned short));

                    unsigned char r = 0;
                    unsigned char g = 0;
                    unsigned char b = 0;
                    unsigned char a = 0;

                    for (int i = 0; i < image->width*image->height; i++)
                    {
                        r = (unsigned char)(round(pixels[i].x*15.0f));
                        g = (unsigned char)(round(pixels[i].y*15.0f));
                        b = (unsigned char)(round(pixels[i].z*15.0f));
                        a = (unsigned char)(round(pixels[i].w*15.0f));

                        ((unsigned short *)image->data)[i] = (unsigned short)r << 12 | (unsigned short)g << 8 | (unsigned short)b << 4 | (unsigned short)a;
                    }

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R8G8B8A8:
                {
                    image->data = (unsigned char *)RL_MALLOC(image->width*image->height*4*sizeof(unsigned char));

                    for (int i = 0, k = 0; i < image->width*image->height*4; i += 4, k++)
                    {
                        ((unsigned char *)image->data)[i] = (unsigned char)(pixels[k].x*255.0f);
                        ((unsigned char *)image->data)[i + 1] = (unsigned char)(pixels[k].y*255.0f);
                        ((unsigned char *)image->data)[i + 2] = (unsigned char)(pixels[k].z*255.0f);
                        ((unsigned char *)image->data)[i + 3] = (unsigned char)(pixels[k].w*255.0f);
                    }
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R32:
                {
                    // WARNING: Image is converted to GRAYSCALE eqeuivalent 32bit

                    image->data = (float *)RL_MALLOC(image->width*image->height*sizeof(float));

                    for (int i = 0; i < image->width*image->height; i++)
                    {
                        ((float *)image->data)[i] = (float)(pixels[i].x*0.299f + pixels[i].y*0.587f + pixels[i].z*0.114f);
                    }
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R32G32B32:
                {
                    image->data = (float *)RL_MALLOC(image->width*image->height*3*sizeof(float));

                    for (int i = 0, k = 0; i < image->width*image->height*3; i += 3, k++)
                    {
                        ((float *)image->data)[i] = pixels[k].x;
                        ((float *)image->data)[i + 1] = pixels[k].y;
                        ((float *)image->data)[i + 2] = pixels[k].z;
                    }
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R32G32B32A32:
                {
                    image->data = (float *)RL_MALLOC(image->width*image->height*4*sizeof(float));

                    for (int i = 0, k = 0; i < image->width*image->height*4; i += 4, k++)
                    {
                        ((float *)image->data)[i] = pixels[k].x;
                        ((float *)image->data)[i + 1] = pixels[k].y;
                        ((float *)image->data)[i + 2] = pixels[k].z;
                        ((float *)image->data)[i + 3] = pixels[k].w;
                    }
                } break;
                default: break;
            }

            RL_FREE(pixels);
            pixels = NULL;

            // In case original image had mipmaps, generate mipmaps for formated image
            // NOTE: Original mipmaps are replaced by new ones, if custom mipmaps were used, they are lost
            if (image->mipmaps > 1)
            {
                image->mipmaps = 1;
            #if defined(SUPPORT_IMAGE_MANIPULATION)
                if (image->data != NULL) ImageMipmaps(image);
            #endif
            }
        }
        else TRACELOG(LOG_WARNING, "IMAGE: Data format is compressed, can not be converted");
    }
}